

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void fight_prog_scales(OBJ_DATA *obj,CHAR_DATA *ch)

{
  CHAR_DATA *ch_00;
  PC_DATA *pPVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = obj->value[2];
  if (iVar3 == 2) {
    iVar3 = number_percent();
    if (0x55 < iVar3) {
      act("$p throbs momentarily, and you feel invigorated!",ch,obj,(void *)0x0,3);
      act("$n looks a bit more refreshed.",ch,obj,(void *)0x0,0);
      iVar3 = number_percent();
      if (iVar3 < 0x33) {
        ch->mana = ch->mana + ch->level;
      }
      else {
        ch->hit = ch->hit + (int)ch->level;
      }
    }
  }
  else {
    ch_00 = ch->fighting;
    if (iVar3 == 1) {
      iVar3 = number_percent();
      if (((0x55 < iVar3) && (bVar2 = is_npc(ch_00), !bVar2)) &&
         (bVar2 = is_immortal(ch_00), !bVar2)) {
        act("$N\'s $p begins to glow, and you feel drained.",ch_00,obj,ch,2);
        act("Your $p begins to glow as it drains energy from $n.",ch,obj,ch_00,3);
        pPVar1 = ch_00->pcdata;
        pPVar1->condition[2] = 5;
        pPVar1->condition[3] = 5;
      }
    }
    else if ((iVar3 == 0) && (iVar3 = number_percent(), 0x5b < iVar3)) {
      act("Ethereal green tendrils reach out of your tattoo and lash out at $N!",ch,obj,ch_00,3);
      act("Ethereal green tendrils reach out of $n\'s tattoo and lash out at you!",ch,obj,ch_00,2);
      act("Ethereal green tendrils reach out of $n\'s tattoo and lash out at $N!",ch,obj,ch_00,0);
      damage_new(ch,ch_00,(int)ch->level,-1,0x13,true,false,0,1,"lashing tendrils");
    }
  }
  return;
}

Assistant:

void fight_prog_scales(OBJ_DATA *obj, CHAR_DATA *ch)
{
	CHAR_DATA *victim = ch->fighting;

	switch (obj->value[2])
	{
		case 0:
			if (number_percent() > 91)
			{
				act("Ethereal green tendrils reach out of your tattoo and lash out at $N!", ch, obj, victim, TO_CHAR);
				act("Ethereal green tendrils reach out of $n's tattoo and lash out at you!", ch, obj, victim, TO_VICT);
				act("Ethereal green tendrils reach out of $n's tattoo and lash out at $N!", ch, obj, victim, TO_ROOM);

				damage_new(ch, victim, ch->level, TYPE_UNDEFINED, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "lashing tendrils");
			}

			break;
		case 1:
			if (number_percent() > 85 && !is_npc(victim) && !is_immortal(victim))
			{
				act("$N's $p begins to glow, and you feel drained.", victim, obj, ch, TO_VICT);
				act("Your $p begins to glow as it drains energy from $n.", ch, obj, victim, TO_CHAR);

				victim->pcdata->condition[COND_HUNGER] = 5;
				victim->pcdata->condition[COND_THIRST] = 5;
			}

			break;
		case 2:
			if (number_percent() > 85)
			{
				act("$p throbs momentarily, and you feel invigorated!", ch, obj, 0, TO_CHAR);
				act("$n looks a bit more refreshed.", ch, obj, 0, TO_ROOM);

				if (number_percent() > 50)
					ch->hit += ch->level;
				else
					ch->mana += ch->level;
			}
			break;
	}
}